

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

int16_t float32_to_q16(float32 a,float_status *status)

{
  int iVar1;
  float32 a_00;
  uint uVar2;
  int32_t iVar3;
  int ieee_ex;
  int32_t q_max;
  int32_t q_min;
  int32_t q_val;
  float_status *status_local;
  float32 a_local;
  
  iVar1 = float32_is_any_nan(a);
  if (iVar1 == 0) {
    a_00 = float32_scalbn_mips64el(a,0xf,status);
    uVar2 = get_float_exception_flags(status);
    set_float_exception_flags(uVar2 & 0xffffffef,status);
    if ((uVar2 & 8) == 0) {
      iVar3 = float32_to_int32_mips64el(a_00,status);
      uVar2 = get_float_exception_flags(status);
      set_float_exception_flags(uVar2 & 0xffffffef,status);
      if ((uVar2 & 1) == 0) {
        if (iVar3 < -0x8000) {
          float_raise_mips64el('(',status);
          status_local._6_2_ = -0x8000;
        }
        else if (iVar3 < 0x8000) {
          status_local._6_2_ = (int16_t)iVar3;
        }
        else {
          float_raise_mips64el('(',status);
          status_local._6_2_ = 0x7fff;
        }
      }
      else {
        set_float_exception_flags(uVar2 & 0xfffffffe,status);
        float_raise_mips64el('(',status);
        if ((int)a_00 < 0) {
          status_local._6_2_ = -0x8000;
        }
        else {
          status_local._6_2_ = 0x7fff;
        }
      }
    }
    else {
      float_raise_mips64el(' ',status);
      if ((int)a_00 < 0) {
        status_local._6_2_ = -0x8000;
      }
      else {
        status_local._6_2_ = 0x7fff;
      }
    }
  }
  else {
    float_raise_mips64el('\x01',status);
    status_local._6_2_ = 0;
  }
  return status_local._6_2_;
}

Assistant:

static inline int16_t float32_to_q16(float32 a, float_status *status)
{
    int32_t q_val;
    int32_t q_min = 0xffff8000;
    int32_t q_max = 0x00007fff;

    int ieee_ex;

    if (float32_is_any_nan(a)) {
        float_raise(float_flag_invalid, status);
        return 0;
    }

    /* scaling */
    a = float32_scalbn(a, 15, status);

    ieee_ex = get_float_exception_flags(status);
    set_float_exception_flags(ieee_ex & (~float_flag_underflow)
                             , status);

    if (ieee_ex & float_flag_overflow) {
        float_raise(float_flag_inexact, status);
        return (int32_t)a < 0 ? q_min : q_max;
    }

    /* conversion to int */
    q_val = float32_to_int32(a, status);

    ieee_ex = get_float_exception_flags(status);
    set_float_exception_flags(ieee_ex & (~float_flag_underflow)
                             , status);

    if (ieee_ex & float_flag_invalid) {
        set_float_exception_flags(ieee_ex & (~float_flag_invalid)
                               , status);
        float_raise(float_flag_overflow | float_flag_inexact, status);
        return (int32_t)a < 0 ? q_min : q_max;
    }

    if (q_val < q_min) {
        float_raise(float_flag_overflow | float_flag_inexact, status);
        return (int16_t)q_min;
    }

    if (q_max < q_val) {
        float_raise(float_flag_overflow | float_flag_inexact, status);
        return (int16_t)q_max;
    }

    return (int16_t)q_val;
}